

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::addDockWidget
          (QMainWindowLayout *this,DockWidgetArea area,QDockWidget *dockwidget,
          Orientation orientation)

{
  bool bVar1;
  DockWidgetArea in_ESI;
  QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *in_RDI;
  QLayout *unaff_retaddr;
  Orientation in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000028;
  QPoint *in_stack_ffffffffffffffd0;
  
  QLayout::addChildWidget(unaff_retaddr,(QWidget *)in_RDI);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x5f6920);
  if (!bVar1) {
    QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::endSeparatorMove
              (in_RDI,in_stack_ffffffffffffffd0);
  }
  toDockPos(in_ESI);
  QDockAreaLayout::addDockWidget
            ((QDockAreaLayout *)CONCAT44(area,in_stack_00000028),dockwidget._4_4_,
             (QDockWidget *)CONCAT44(orientation,in_stack_00000018),in_stack_00000014);
  (**(code **)&(in_RDI->hoverSeparator).d.d[7].super_QArrayData)();
  return;
}

Assistant:

void QMainWindowLayout::addDockWidget(Qt::DockWidgetArea area,
                                             QDockWidget *dockwidget,
                                             Qt::Orientation orientation)
{
    addChildWidget(dockwidget);

    // If we are currently moving a separator, then we need to abort the move, since each
    // time we move the mouse layoutState is replaced by savedState modified by the move.
    if (!movingSeparator.isEmpty())
        endSeparatorMove(movingSeparatorPos);

    layoutState.dockAreaLayout.addDockWidget(toDockPos(area), dockwidget, orientation);
    invalidate();
}